

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

int __thiscall QAccessibleMdiArea::childCount(QAccessibleMdiArea *this)

{
  QMdiArea *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QMdiSubWindow_*> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMdiArea *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  QMdiArea::subWindowList((QList<QMdiSubWindow_*> *)&local_30,this_00,CreationOrder);
  QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)local_30.size;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMdiArea::childCount() const
{
    return mdiArea()->subWindowList().size();
}